

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_parser.h
# Opt level: O1

void __thiscall CMakeParser::SetDebugMode(CMakeParser *this,DebugMode mode)

{
  yyscan_t yyscanner;
  int _bdebug;
  
  switch(mode) {
  case Disabled:
    yy::parser::set_debug_level(&this->parser,0);
    yyscanner = (this->scanner).yyscanner;
    _bdebug = 0;
    break;
  case Parser:
    yy::parser::set_debug_level(&this->parser,1);
    return;
  case Full:
    yy::parser::set_debug_level(&this->parser,1);
  case Scanner:
    yyscanner = (this->scanner).yyscanner;
    _bdebug = 1;
    break;
  default:
    return;
  }
  yyset_debug(_bdebug,yyscanner);
  return;
}

Assistant:

void SetDebugMode(const DebugMode mode)
    {
        switch(mode)
        {
        case DebugMode::Disabled:
            parser.set_debug_level(0);
            scanner.SetDebug(false);
            break;
        case DebugMode::Parser:
            parser.set_debug_level(1);
            break;
        case DebugMode::Scanner:
            scanner.SetDebug(true);
            break;
        case DebugMode::Full:
            parser.set_debug_level(1);
            scanner.SetDebug(true);
            break;
        default:
            break;
        }
    }